

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O0

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val,void *void_key)

{
  long lVar1;
  tommy_uint32_t tVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  uint local_44;
  tommy_uint32_t v;
  tommy_uint32_t c;
  tommy_uint32_t b;
  tommy_uint32_t a;
  uchar *key;
  void *void_key_local;
  tommy_uint64_t init_val_local;
  tommy_uint32_t m [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = (int)init_val + 0xdeadbeef;
  v = local_44;
  c = local_44;
  _b = void_key;
  do {
    tVar2 = tommy_le_uint32_read(_b);
    iVar3 = tommy_haszero_u32(tVar2);
    if (iVar3 != 0) {
      if ((((tVar2 & 0xff) != 0) && (c = (tVar2 & 0xff) + c, (tVar2 & 0xff00) != 0)) &&
         (c = (tVar2 & 0xff00) + c, (tVar2 & 0xff0000) != 0)) {
        c = (tVar2 & 0xff0000) + c;
      }
LAB_00114079:
      uVar5 = (v ^ local_44) - (v << 0xe | v >> 0x12);
      uVar6 = (uVar5 ^ c) - (uVar5 * 0x800 | uVar5 >> 0x15);
      uVar7 = (uVar6 ^ v) - (uVar6 * 0x2000000 | uVar6 >> 7);
      uVar5 = (uVar7 ^ uVar5) - (uVar7 * 0x10000 | uVar7 >> 0x10);
      uVar6 = (uVar5 ^ uVar6) - (uVar5 * 0x10 | uVar5 >> 0x1c);
      uVar6 = (uVar6 ^ uVar7) - (uVar6 * 0x4000 | uVar6 >> 0x12);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (uVar6 ^ uVar5) - (uVar6 * 0x1000000 | uVar6 >> 8);
    }
    c = tVar2 + c;
    tVar2 = tommy_le_uint32_read((void *)((long)_b + 4));
    iVar3 = tommy_haszero_u32(tVar2);
    if (iVar3 != 0) {
      if ((((tVar2 & 0xff) != 0) && (v = (tVar2 & 0xff) + v, (tVar2 & 0xff00) != 0)) &&
         (v = (tVar2 & 0xff00) + v, (tVar2 & 0xff0000) != 0)) {
        v = (tVar2 & 0xff0000) + v;
      }
      goto LAB_00114079;
    }
    v = tVar2 + v;
    tVar2 = tommy_le_uint32_read((void *)((long)_b + 8));
    iVar3 = tommy_haszero_u32(tVar2);
    if (iVar3 != 0) {
      if ((((tVar2 & 0xff) != 0) && (local_44 = (tVar2 & 0xff) + local_44, (tVar2 & 0xff00) != 0))
         && (local_44 = (tVar2 & 0xff00) + local_44, (tVar2 & 0xff0000) != 0)) {
        local_44 = (tVar2 & 0xff0000) + local_44;
      }
      goto LAB_00114079;
    }
    local_44 = tVar2 + local_44;
    uVar5 = (local_44 * 0x10 | local_44 >> 0x1c) ^ c - local_44;
    uVar6 = (uVar5 << 6 | uVar5 >> 0x1a) ^ v - uVar5;
    iVar3 = v + local_44 + uVar5;
    uVar5 = (uVar6 << 8 | uVar6 >> 0x18) ^ (v + local_44) - uVar6;
    iVar4 = iVar3 + uVar6;
    uVar6 = (uVar5 << 0x10 | uVar5 >> 0x10) ^ iVar3 - uVar5;
    iVar3 = iVar4 + uVar5;
    uVar5 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar4 - uVar6;
    c = iVar3 + uVar6;
    local_44 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar3 - uVar5;
    v = c + uVar5;
    _b = (void *)((long)_b + 0xc);
  } while( true );
}

Assistant:

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val, const void* void_key)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;
	tommy_uint32_t m[3] = { 0xff, 0xff00, 0xff0000 };

	a = b = c = 0xdeadbeef + init_val;
	/* this is different than original lookup3 and the result won't match */

	while (1) {
		tommy_uint32_t v = tommy_le_uint32_read(key);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				a += v & m[0];
				if (v & m[1]) {
					a += v & m[1];
					if (v & m[2])
						a += v & m[2];
				}
			}

			break;
		}

		a += v;

		v = tommy_le_uint32_read(key + 4);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				b += v & m[0];
				if (v & m[1]) {
					b += v & m[1];
					if (v & m[2])
						b += v & m[2];
				}
			}

			break;
		}

		b += v;

		v = tommy_le_uint32_read(key + 8);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				c += v & m[0];
				if (v & m[1]) {
					c += v & m[1];
					if (v & m[2])
						c += v & m[2];
				}
			}

			break;
		}

		c += v;

		tommy_mix(a, b, c);

		key += 12;
	}

	/* for lengths that are multiplers of 12 we already have called mix */
	/* this is different than the original lookup3 and the result won't match */

	tommy_final(a, b, c);

	return c;
}